

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_find_mv_refs(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mi,MV_REFERENCE_FRAME ref_frame,
                     uint8_t *ref_mv_count,CANDIDATE_MV (*ref_mv_stack) [8],
                     uint16_t (*ref_mv_weight) [8],int_mv (*mv_ref_list) [2],int_mv *global_mvs,
                     int16_t *mode_context)

{
  uint16_t (*ref_mv_weight_00) [8];
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  MB_MODE_INFO **ppMVar7;
  MB_MODE_INFO *pMVar8;
  int iVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ushort uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [12];
  byte bVar16;
  ushort uVar17;
  int idx;
  int_mv iVar18;
  int iVar19;
  int_mv (*paiVar20) [2];
  ulong uVar21;
  int (*paiVar22) [2];
  ulong uVar23;
  uint uVar28;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  int_mv *piVar27;
  ulong uVar29;
  int row;
  byte *pbVar30;
  int iVar31;
  int *piVar32;
  byte bVar33;
  byte bVar34;
  short sVar35;
  uint uVar36;
  int iVar37;
  char cVar38;
  uint uVar39;
  int iVar40;
  int16_t iVar41;
  int iVar42;
  uint uVar43;
  int cmp_idx_1;
  long lVar44;
  int cmp_idx;
  uint uVar45;
  byte *refmv_count;
  long lVar46;
  long lVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  CANDIDATE_MV CVar52;
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint8_t row_match_count;
  uint8_t newmv_count;
  byte local_160 [2];
  uint8_t col_match_count;
  uint8_t dummy_newmv_count;
  uint local_15c;
  CANDIDATE_MV *local_158;
  int_mv gm_mv [2];
  uint local_128;
  uint local_124;
  uint local_10c;
  uint local_fc;
  int ref_diff_count [2];
  int ref_id_count [2];
  int_mv local_c8 [6];
  ulong local_b0;
  int local_a4;
  uint local_a0;
  uint local_9c;
  int tpl_sample_pos [3] [2];
  uint local_78;
  int_mv ref_diff [2] [2];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  
  uVar25 = xd->mi_row;
  uVar39 = xd->mi_col;
  local_15c = uVar25;
  if (ref_frame == '\0') {
    gm_mv[0] = (int_mv)0x0;
    gm_mv[1] = (int_mv)0x0;
    if (global_mvs != (int_mv *)0x0) {
      global_mvs->as_int = 0x80008000;
    }
  }
  else {
    uVar28 = (uint)(cm->features).allow_high_precision_mv;
    bVar48 = (cm->features).cur_frame_force_integer_mv;
    BVar1 = mi->bsize;
    if (ref_frame < '\b') {
      gm_mv[0] = gm_get_motion_vector
                           (cm->global_motion + ref_frame,uVar28,BVar1,uVar39,uVar25,(uint)bVar48);
      gm_mv[1].as_int = 0;
      if (global_mvs != (int_mv *)0x0) {
        global_mvs[ref_frame] = gm_mv[0];
      }
    }
    else {
      local_158 = (CANDIDATE_MV *)(long)ref_frame_map[(byte)ref_frame - 8][1];
      gm_mv[0] = gm_get_motion_vector
                           (cm->global_motion + ref_frame_map[(byte)ref_frame - 8][0],uVar28,BVar1,
                            uVar39,uVar25,(uint)bVar48);
      iVar18 = gm_get_motion_vector
                         (cm->global_motion + (long)local_158,uVar28,BVar1,uVar39,uVar25,
                          (uint)bVar48);
      gm_mv[1].as_int = iVar18.as_int;
    }
  }
  uVar25 = local_15c;
  refmv_count = ref_mv_count + ref_frame;
  paiVar20 = mv_ref_list + ref_frame;
  if (mv_ref_list == (int_mv (*) [2])0x0) {
    paiVar20 = (int_mv (*) [2])0x0;
  }
  uVar28._0_1_ = xd->width;
  uVar28._1_1_ = xd->height;
  uVar28._2_2_ = *(undefined2 *)&xd->field_0x2076;
  bVar24 = xd->height;
  uVar43 = (uint)bVar24;
  if (bVar24 < (byte)(undefined1)uVar28) {
    uVar43 = uVar28;
  }
  iVar19 = has_top_right(cm,xd,local_15c,uVar39,uVar43 & 0xff);
  bVar24 = bVar24 < 2 & (byte)uVar25;
  if (ref_frame < '\b') {
    local_160[0] = ref_frame;
    local_160[1] = -1;
  }
  else {
    local_160[1] = ref_frame_map[(byte)ref_frame - 8][1];
    local_160[0] = ref_frame_map[(byte)ref_frame - 8][0];
  }
  bVar16 = (byte)(undefined1)uVar28 < 2 & (byte)uVar39;
  mode_context[ref_frame] = 0;
  *refmv_count = 0;
  local_124 = 0;
  local_128 = 0;
  if (xd->up_available == true) {
    uVar25 = (bVar24 - 6) + (uint)(xd->height < 2) * 2;
    local_128 = ~local_15c + (xd->tile).mi_row_end;
    uVar28 = (xd->tile).mi_row_start - local_15c;
    if ((int)uVar25 < (int)local_128) {
      local_128 = uVar25;
    }
    if ((int)uVar25 < (int)uVar28) {
      local_128 = uVar28;
    }
  }
  if (xd->left_available == true) {
    uVar25 = (bVar16 - 6) + (uint)(xd->width < 2) * 2;
    local_124 = ~uVar39 + (xd->tile).mi_col_end;
    uVar28 = (xd->tile).mi_col_start - uVar39;
    if ((int)uVar25 < (int)local_124) {
      local_124 = uVar25;
    }
    if ((int)uVar25 < (int)uVar28) {
      local_124 = uVar28;
    }
  }
  local_158 = ref_mv_stack[ref_frame];
  ref_mv_weight_00 = ref_mv_weight + ref_frame;
  col_match_count = '\0';
  row_match_count = '\0';
  local_fc = 0;
  newmv_count = '\0';
  local_9c = -local_128;
  if (0 < (int)local_128) {
    local_9c = local_128;
  }
  local_10c = 0;
  if (local_128 != 0) {
    bVar2 = xd->width;
    uVar25 = (cm->mi_params).mi_cols - uVar39;
    if ((int)(uint)bVar2 <= (int)uVar25) {
      uVar25 = (uint)bVar2;
    }
    uVar28 = 0x10;
    if ((int)uVar25 < 0x10) {
      uVar28 = uVar25;
    }
    local_10c = 0;
    if (0 < (int)uVar25) {
      ppMVar7 = xd->mi;
      iVar42 = xd->mi_stride;
      local_10c = 0;
      uVar25 = 0;
      do {
        BVar1 = ppMVar7[(ulong)uVar25 - (long)iVar42]->bsize;
        bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
        uVar43._0_1_ = xd->width;
        uVar43._1_1_ = xd->height;
        uVar43._2_2_ = *(undefined2 *)&xd->field_0x2076;
        uVar45 = uVar43;
        if (bVar3 <= (byte)(undefined1)uVar43) {
          uVar45 = (uint)bVar3;
        }
        uVar45 = uVar45 & 0xff;
        uVar36 = uVar45;
        if (uVar45 < 5) {
          uVar36 = 4;
        }
        if (0xf < bVar2) {
          uVar45 = uVar36;
        }
        uVar36 = 2;
        if ((1 < (byte)(undefined1)uVar43) && ((byte)(undefined1)uVar43 <= bVar3)) {
          local_10c = -local_128;
          if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [BVar1] <= (int)-local_128) {
            local_10c = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar1];
          }
          local_10c = local_10c & 0xffff;
          uVar36 = local_10c;
          if (local_10c < 3) {
            uVar36 = 2;
          }
        }
        add_ref_mv_candidate
                  (ppMVar7[(ulong)uVar25 - (long)iVar42],(MV_REFERENCE_FRAME *)local_160,refmv_count
                   ,&row_match_count,&newmv_count,local_158,*ref_mv_weight_00,gm_mv,
                   cm->global_motion,(short)uVar36 * (short)uVar45);
        uVar25 = uVar25 + uVar45;
      } while ((int)uVar25 < (int)uVar28);
    }
  }
  local_a0 = -local_124;
  if (0 < (int)local_124) {
    local_a0 = local_124;
  }
  if (local_124 != 0) {
    bVar2 = xd->height;
    uVar25 = (cm->mi_params).mi_rows - local_15c;
    if ((int)(uint)bVar2 <= (int)uVar25) {
      uVar25 = (uint)bVar2;
    }
    uVar28 = 0x10;
    if ((int)uVar25 < 0x10) {
      uVar28 = uVar25;
    }
    if (0 < (int)uVar25) {
      local_fc = 0;
      iVar42 = 0;
      do {
        BVar1 = xd->mi[(long)iVar42 * (long)xd->mi_stride + -1]->bsize;
        bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
        bVar4 = xd->height;
        bVar33 = bVar3;
        if (bVar4 < bVar3) {
          bVar33 = bVar4;
        }
        uVar25 = 4;
        if (4 < bVar33) {
          uVar25 = (uint)bVar33;
        }
        if (bVar2 < 0x10) {
          uVar25 = (uint)bVar33;
        }
        sVar35 = 2;
        if ((1 < bVar4) && (bVar4 <= bVar3)) {
          local_fc = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1];
          if ((int)-local_124 <
              (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar1]) {
            local_fc = -local_124;
          }
          uVar43 = 2;
          if (2 < (int)local_fc) {
            uVar43 = local_fc;
          }
          sVar35 = (short)uVar43;
        }
        add_ref_mv_candidate
                  (xd->mi[(long)iVar42 * (long)xd->mi_stride + -1],(MV_REFERENCE_FRAME *)local_160,
                   refmv_count,&col_match_count,&newmv_count,local_158,*ref_mv_weight_00,gm_mv,
                   cm->global_motion,sVar35 * (short)uVar25);
        iVar42 = iVar42 + uVar25;
      } while (iVar42 < (int)uVar28);
    }
  }
  uVar25 = local_15c;
  if ((iVar19 != 0) && ((xd->tile).mi_row_start < (int)local_15c)) {
    iVar19 = uVar39 + xd->width;
    if (((xd->tile).mi_col_start <= iVar19) &&
       (((int)local_15c <= (xd->tile).mi_row_end && (iVar19 < (xd->tile).mi_col_end)))) {
      add_ref_mv_candidate
                (xd->mi[(ulong)xd->width - (long)xd->mi_stride],(MV_REFERENCE_FRAME *)local_160,
                 refmv_count,&row_match_count,&newmv_count,local_158,*ref_mv_weight_00,gm_mv,
                 cm->global_motion,4);
    }
  }
  local_a4 = ((col_match_count != '\0') + 1) - (uint)(row_match_count == '\0');
  bVar2 = *refmv_count;
  uVar23 = (ulong)bVar2;
  if (bVar2 != 0) {
    uVar21 = 0;
    do {
      (*ref_mv_weight_00)[uVar21] = (*ref_mv_weight_00)[uVar21] + 0x280;
      uVar21 = uVar21 + 1;
    } while (uVar23 != uVar21);
  }
  if ((cm->features).allow_ref_frame_mvs != false) {
    bVar3 = xd->height;
    tpl_sample_pos[0][0] = 2;
    if (2 < bVar3) {
      tpl_sample_pos[0][0] = (uint)bVar3;
    }
    bVar4 = xd->width;
    tpl_sample_pos[1][1] = 2;
    if (2 < bVar4) {
      tpl_sample_pos[1][1] = (int)bVar4;
    }
    uVar25 = (uint)bVar4;
    if (0xf < bVar4) {
      uVar25 = 0x10;
    }
    uVar28 = 0x10;
    if (0xf >= bVar3) {
      uVar28 = (uint)bVar3;
    }
    tpl_sample_pos[0][1] = -2;
    tpl_sample_pos[1][0] = tpl_sample_pos[0][0];
    tpl_sample_pos[2][0] = tpl_sample_pos[0][0] - 2;
    tpl_sample_pos[2][1] = tpl_sample_pos[1][1];
    cVar38 = (byte)(bVar4 - 2) < 0xe && (byte)(bVar3 - 2) < 0xe;
    if (bVar3 == 0) {
LAB_003a2dad:
      *(byte *)(mode_context + ref_frame) = *(byte *)(mode_context + ref_frame) | 8;
    }
    else {
      local_b0 = CONCAT71(local_b0._1_7_,cVar38);
      iVar19 = 0;
      uVar43 = 0;
      do {
        if (bVar4 != 0) {
          uVar45 = 0;
          do {
            iVar42 = add_tpl_ref_mv(cm,xd,local_15c,uVar39,ref_frame,uVar43,uVar45,gm_mv,refmv_count
                                    ,local_158,*ref_mv_weight_00,mode_context);
            if (uVar45 == 0 && uVar43 == 0) {
              iVar19 = iVar42;
            }
            uVar45 = uVar45 + (uint)(0xf < bVar4) * 2 + 2;
          } while (uVar45 < uVar25);
        }
        uVar43 = uVar43 + (uint)(0xf < bVar3) * 2 + 2;
      } while (uVar43 < uVar28);
      cVar38 = (char)local_b0;
      if (iVar19 == 0) goto LAB_003a2dad;
    }
    uVar25 = local_15c;
    if (cVar38 != '\0') {
      uVar28 = local_15c & 0xf;
      lVar46 = 0;
      do {
        if ((tpl_sample_pos[lVar46][0] + uVar28 < 0x10) &&
           (tpl_sample_pos[lVar46][1] + (uVar39 & 0xf) < 0x10)) {
          add_tpl_ref_mv(cm,xd,local_15c,uVar39,ref_frame,tpl_sample_pos[lVar46][0],
                         tpl_sample_pos[lVar46][1],gm_mv,refmv_count,local_158,*ref_mv_weight_00,
                         mode_context);
        }
        lVar46 = lVar46 + 1;
        uVar25 = local_15c;
      } while (lVar46 != 3);
    }
  }
  dummy_newmv_count = '\0';
  if (((((xd->tile).mi_row_start < (int)uVar25) && ((xd->tile).mi_col_start < (int)uVar39)) &&
      ((int)uVar25 <= (xd->tile).mi_row_end)) && ((int)uVar39 <= (xd->tile).mi_col_end)) {
    add_ref_mv_candidate
              (xd->mi[~(long)xd->mi_stride],(MV_REFERENCE_FRAME *)local_160,refmv_count,
               &row_match_count,&dummy_newmv_count,local_158,*ref_mv_weight_00,gm_mv,
               cm->global_motion,4);
  }
  local_b0 = 2;
  do {
    iVar19 = (int)local_b0 * -2 + 1;
    uVar28 = iVar19 + (uint)bVar24;
    uVar25 = -uVar28;
    if (0 < (int)uVar28) {
      uVar25 = uVar28;
    }
    if ((uVar25 <= local_9c) && ((int)local_10c < (int)uVar25)) {
      bVar3 = xd->width;
      uVar25 = (cm->mi_params).mi_cols - uVar39;
      if ((int)(uint)bVar3 <= (int)uVar25) {
        uVar25 = (uint)bVar3;
      }
      uVar43 = 0x10;
      if ((int)uVar25 < 0x10) {
        uVar43 = uVar25;
      }
      if (0 < (int)uVar25) {
        iVar42 = xd->mi_stride;
        ppMVar7 = xd->mi;
        uVar25 = (uVar28 - local_128) + 1;
        iVar31 = 0;
        do {
          BVar1 = ppMVar7[(long)(int)uVar28 * (long)iVar42 +
                          (ulong)((uint)((uVar39 & 1) == 0 || 1 < bVar3) + iVar31)]->bsize;
          bVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [BVar1];
          uVar5 = xd->width;
          bVar33 = bVar4;
          if ((byte)uVar5 < bVar4) {
            bVar33 = uVar5;
          }
          if (bVar3 < 0x10) {
            bVar48 = bVar33 < 3;
            uVar45 = 2;
          }
          else {
            bVar48 = bVar33 < 5;
            uVar45 = 4;
          }
          uVar36 = (uint)bVar33;
          if (bVar48) {
            uVar36 = uVar45;
          }
          sVar35 = 2;
          if ((1 < (byte)uVar5) && ((byte)uVar5 <= bVar4)) {
            local_10c = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar1];
            if ((int)uVar25 <
                (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar1]) {
              local_10c = uVar25;
            }
            local_10c = local_10c & 0xffff;
            uVar45 = 2;
            if (2 < local_10c) {
              uVar45 = local_10c;
            }
            sVar35 = (short)uVar45;
            local_10c = local_10c + ~uVar28;
          }
          add_ref_mv_candidate
                    (ppMVar7[(long)(int)uVar28 * (long)iVar42 +
                             (ulong)((uint)((uVar39 & 1) == 0 || 1 < bVar3) + iVar31)],
                     (MV_REFERENCE_FRAME *)local_160,refmv_count,&row_match_count,&dummy_newmv_count
                     ,local_158,*ref_mv_weight_00,gm_mv,cm->global_motion,sVar35 * (short)uVar36);
          iVar31 = iVar31 + uVar36;
        } while (iVar31 < (int)uVar43);
      }
    }
    local_78 = (uint)bVar16;
    local_78 = iVar19 + local_78;
    uVar25 = -local_78;
    if (0 < (int)local_78) {
      uVar25 = local_78;
    }
    if ((uVar25 <= local_a0) && ((int)local_fc < (int)uVar25)) {
      uVar25 = local_15c & 1;
      bVar3 = xd->height;
      uVar28 = (cm->mi_params).mi_rows - local_15c;
      if ((int)(uint)bVar3 <= (int)uVar28) {
        uVar28 = (uint)bVar3;
      }
      uVar43 = 0x10;
      if ((int)uVar28 < 0x10) {
        uVar43 = uVar28;
      }
      if (0 < (int)uVar28) {
        uVar28 = (local_78 - local_124) + 1;
        iVar19 = 0;
        do {
          BVar1 = xd->mi[(int)(((uint)(uVar25 == 0 || 1 < bVar3) + iVar19) * xd->mi_stride +
                              local_78)]->bsize;
          bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar1];
          bVar33 = xd->height;
          bVar34 = bVar4;
          if (bVar33 < bVar4) {
            bVar34 = bVar33;
          }
          if (bVar3 < 0x10) {
            bVar48 = bVar34 < 3;
            uVar45 = 2;
          }
          else {
            bVar48 = bVar34 < 5;
            uVar45 = 4;
          }
          uVar36 = (uint)bVar34;
          if (bVar48) {
            uVar36 = uVar45;
          }
          sVar35 = 2;
          if ((1 < bVar33) && (bVar33 <= bVar4)) {
            local_fc = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [BVar1];
            if ((int)uVar28 <
                (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1]) {
              local_fc = uVar28;
            }
            uVar45 = 2;
            if (2 < (int)local_fc) {
              uVar45 = local_fc;
            }
            sVar35 = (short)uVar45;
            local_fc = local_fc + ~local_78;
          }
          add_ref_mv_candidate
                    (xd->mi[(int)(((uint)(uVar25 == 0 || 1 < bVar3) + iVar19) * xd->mi_stride +
                                 local_78)],(MV_REFERENCE_FRAME *)local_160,refmv_count,
                     &col_match_count,&dummy_newmv_count,local_158,*ref_mv_weight_00,gm_mv,
                     cm->global_motion,sVar35 * (short)uVar36);
          iVar19 = iVar19 + uVar36;
        } while (iVar19 < (int)uVar43);
      }
    }
    uVar25 = (int)local_b0 + 1;
    local_b0 = (ulong)uVar25;
  } while (uVar25 != 4);
  if (local_a4 == 0) {
    if (col_match_count != '\0' || row_match_count != '\0') {
      *(byte *)(mode_context + ref_frame) = *(byte *)(mode_context + ref_frame) | 1;
    }
    if ((row_match_count != '\0') == (col_match_count != '\0')) {
      if (row_match_count == '\0' || col_match_count == '\0') goto LAB_003a3296;
      uVar17 = mode_context[ref_frame] | 0x20;
    }
    else {
      uVar17 = mode_context[ref_frame] | 0x10;
    }
  }
  else if (local_a4 == 1) {
    uVar17 = (ushort)(newmv_count == '\0') | mode_context[ref_frame];
    mode_context[ref_frame] = uVar17 | 2;
    if ((row_match_count != '\0') == (col_match_count != '\0')) {
      if (row_match_count == '\0' || col_match_count == '\0') goto LAB_003a3296;
      uVar17 = uVar17 | 0x42;
    }
    else {
      uVar17 = uVar17 | 0x32;
    }
  }
  else {
    uVar17 = (ushort)(newmv_count == '\0') | mode_context[ref_frame] | 0x54;
  }
  mode_context[ref_frame] = uVar17;
LAB_003a3296:
  uVar25 = (uint)bVar2;
  uVar21 = uVar23;
  if (uVar23 != 0) {
    do {
      uVar26 = 0;
      if (1 < (uint)uVar21) {
        uVar26 = 0;
        uVar29 = 1;
        do {
          uVar17 = ref_mv_weight_00[-1][uVar29 + 7];
          if (uVar17 < (*ref_mv_weight_00)[uVar29]) {
            auVar50 = *(undefined1 (*) [16])(local_158 + (uVar29 - 1));
            auVar57._0_8_ = auVar50._8_8_;
            auVar57._8_4_ = auVar50._0_4_;
            auVar57._12_4_ = auVar50._4_4_;
            *(undefined1 (*) [16])(local_158 + (uVar29 - 1)) = auVar57;
            ref_mv_weight_00[-1][uVar29 + 7] = (*ref_mv_weight_00)[uVar29];
            (*ref_mv_weight_00)[uVar29] = uVar17;
            uVar26 = uVar29 & 0xffffffff;
          }
          uVar29 = uVar29 + 1;
        } while (uVar21 != uVar29);
      }
      uVar21 = uVar26;
    } while (0 < (int)uVar26);
  }
  uVar28 = (uint)*refmv_count;
  if (bVar2 < *refmv_count) {
    do {
      uVar43 = uVar25;
      if ((int)(uVar25 + 1) < (int)uVar28) {
        uVar21 = uVar23;
        uVar26 = uVar23;
        do {
          uVar17 = ref_mv_weight[ref_frame][uVar21];
          if (uVar17 < ref_mv_weight[ref_frame][uVar21 + 1]) {
            auVar50 = *(undefined1 (*) [16])(local_158 + uVar21);
            auVar49._0_8_ = auVar50._8_8_;
            auVar49._8_4_ = auVar50._0_4_;
            auVar49._12_4_ = auVar50._4_4_;
            *(undefined1 (*) [16])(local_158 + uVar21) = auVar49;
            ref_mv_weight[ref_frame][uVar21] = ref_mv_weight[ref_frame][uVar21 + 1];
            ref_mv_weight[ref_frame][uVar21 + 1] = uVar17;
            uVar26 = (ulong)((int)uVar21 + 1);
          }
          uVar21 = uVar21 + 1;
          uVar43 = (uint)uVar26;
        } while ((ulong)uVar28 - 1 != uVar21);
      }
      uVar28 = uVar43;
    } while ((int)uVar25 < (int)uVar28);
  }
  uVar25._0_1_ = xd->width;
  uVar25._1_1_ = xd->height;
  uVar25._2_2_ = *(undefined2 *)&xd->field_0x2076;
  if (0xf < (byte)(undefined1)uVar25) {
    uVar25 = 0x10;
  }
  uVar39 = (cm->mi_params).mi_cols - uVar39;
  if ((int)(uVar25 & 0xff) <= (int)uVar39) {
    uVar39 = uVar25 & 0xff;
  }
  uVar25 = 0x10;
  if (xd->height < 0x10) {
    uVar25 = (uint)xd->height;
  }
  local_15c = (cm->mi_params).mi_rows - local_15c;
  if ((int)uVar25 <= (int)local_15c) {
    local_15c = uVar25;
  }
  if ((int)uVar39 < (int)local_15c) {
    local_15c = uVar39;
  }
  if ((char)local_160[1] < '\0') {
    if ((local_128 != 0) && (0 < (int)local_15c)) {
      iVar19 = 0;
      do {
        if (1 < *refmv_count) break;
        pMVar8 = xd->mi[iVar19 - xd->mi_stride];
        lVar46 = 0;
        do {
          if (0 < (long)pMVar8->ref_frame[lVar46]) {
            uVar17 = *(ushort *)((long)pMVar8->mv + lVar46 * 4 + 2);
            uVar25 = -pMVar8->mv[lVar46].as_int;
            uVar13 = -uVar17;
            if (cm->ref_frame_sign_bias[pMVar8->ref_frame[lVar46]] ==
                cm->ref_frame_sign_bias[ref_frame]) {
              uVar25 = pMVar8->mv[lVar46].as_int;
              uVar13 = uVar17;
            }
            bVar24 = *refmv_count;
            if (bVar24 == 0) {
              uVar39 = 0;
            }
            else {
              uVar23 = 0;
              do {
                uVar21 = uVar23;
                if ((uVar25 & 0xffff | (uint)uVar13 << 0x10) == local_158[uVar23].this_mv.as_int)
                break;
                uVar23 = uVar23 + 1;
                uVar21 = (ulong)bVar24;
              } while (bVar24 != uVar23);
              uVar39 = (uint)uVar21;
            }
            if (uVar39 == bVar24) {
              local_158[uVar39].this_mv.as_mv.row = (int16_t)uVar25;
              local_158[uVar39].this_mv.as_mv.col = uVar13;
              (*ref_mv_weight_00)[uVar39] = 2;
              *refmv_count = *refmv_count + 1;
            }
          }
          bVar48 = lVar46 == 0;
          lVar46 = lVar46 + 1;
        } while (bVar48);
        iVar19 = iVar19 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [pMVar8->bsize];
      } while (iVar19 < (int)local_15c);
    }
    if ((local_124 != 0) && (0 < (int)local_15c)) {
      iVar19 = 0;
      do {
        if (1 < *refmv_count) break;
        pMVar8 = xd->mi[(long)iVar19 * (long)xd->mi_stride + -1];
        lVar46 = 0;
        do {
          if (0 < (long)pMVar8->ref_frame[lVar46]) {
            uVar17 = *(ushort *)((long)pMVar8->mv + lVar46 * 4 + 2);
            uVar25 = -pMVar8->mv[lVar46].as_int;
            uVar13 = -uVar17;
            if (cm->ref_frame_sign_bias[pMVar8->ref_frame[lVar46]] ==
                cm->ref_frame_sign_bias[ref_frame]) {
              uVar25 = pMVar8->mv[lVar46].as_int;
              uVar13 = uVar17;
            }
            bVar24 = *refmv_count;
            if (bVar24 == 0) {
              uVar39 = 0;
            }
            else {
              uVar23 = 0;
              do {
                uVar21 = uVar23;
                if ((uVar25 & 0xffff | (uint)uVar13 << 0x10) == local_158[uVar23].this_mv.as_int)
                break;
                uVar23 = uVar23 + 1;
                uVar21 = (ulong)bVar24;
              } while (bVar24 != uVar23);
              uVar39 = (uint)uVar21;
            }
            if (uVar39 == bVar24) {
              local_158[uVar39].this_mv.as_mv.row = (int16_t)uVar25;
              local_158[uVar39].this_mv.as_mv.col = uVar13;
              (*ref_mv_weight_00)[uVar39] = 2;
              *refmv_count = *refmv_count + 1;
            }
          }
          bVar48 = lVar46 == 0;
          lVar46 = lVar46 + 1;
        } while (bVar48);
        iVar19 = iVar19 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [pMVar8->bsize];
      } while (iVar19 < (int)local_15c);
    }
    bVar24 = *refmv_count;
    if (bVar24 != 0) {
      iVar31 = xd->mb_to_left_edge + (uint)xd->width * -0x20 + -0x80;
      iVar19 = (uint)xd->width * 0x20 + xd->mb_to_right_edge + 0x80;
      iVar37 = xd->mb_to_top_edge + (uint)xd->height * -0x20 + -0x80;
      iVar42 = (uint)xd->height * 0x20 + xd->mb_to_bottom_edge + 0x80;
      uVar23 = 0;
      do {
        iVar40 = (int)ref_mv_stack[ref_frame][uVar23].this_mv.as_mv.col;
        iVar9 = iVar19;
        if (iVar40 < iVar19) {
          iVar9 = iVar40;
        }
        iVar41 = (int16_t)iVar9;
        if (iVar40 < iVar31) {
          iVar41 = (int16_t)iVar31;
        }
        ref_mv_stack[ref_frame][uVar23].this_mv.as_mv.col = iVar41;
        iVar40 = (int)ref_mv_stack[ref_frame][uVar23].this_mv.as_mv.row;
        iVar9 = iVar42;
        if (iVar40 < iVar42) {
          iVar9 = iVar40;
        }
        iVar41 = (int16_t)iVar9;
        if (iVar40 < iVar37) {
          iVar41 = (int16_t)iVar37;
        }
        ref_mv_stack[ref_frame][uVar23].this_mv.as_mv.row = iVar41;
        uVar23 = uVar23 + 1;
        bVar24 = *refmv_count;
      } while (uVar23 < bVar24);
    }
    if (paiVar20 != (int_mv (*) [2])0x0) {
      if (bVar24 < 2) {
        uVar23 = (ulong)bVar24;
        do {
          (*paiVar20)[uVar23] = gm_mv[0];
          uVar23 = uVar23 + 1;
        } while (uVar23 == 1);
      }
      if (*refmv_count != 0) {
        uVar23 = 0;
        do {
          (*paiVar20)[uVar23] = local_158[uVar23].this_mv;
          uVar23 = uVar23 + 1;
          bVar24 = *refmv_count;
          if (1 < *refmv_count) {
            bVar24 = 2;
          }
        } while (uVar23 < bVar24);
      }
    }
  }
  else {
    uVar23 = (ulong)*refmv_count;
    if (uVar23 < 2) {
      ref_id_count[0] = 0;
      ref_id_count[1] = 0;
      ref_diff_count[0] = 0;
      ref_diff_count[1] = 0;
      if ((local_128 != 0) && (0 < (int)local_15c)) {
        ppMVar7 = xd->mi;
        iVar19 = xd->mi_stride;
        iVar42 = 0;
        do {
          pMVar8 = ppMVar7[iVar42 - iVar19];
          lVar46 = 0;
          do {
            bVar24 = pMVar8->ref_frame[lVar46];
            lVar44 = 0;
            lVar47 = 0;
            pbVar30 = local_160;
            do {
              if (bVar24 == *pbVar30) {
                iVar31 = *(int *)((long)ref_id_count + lVar44);
                if (1 < (long)iVar31) goto LAB_003a3477;
                piVar32 = (int *)((long)ref_id_count + lVar44);
                *(int_mv *)((long)tpl_sample_pos[0] + lVar44 * 2 + (long)iVar31 * 4) =
                     pMVar8->mv[lVar46];
LAB_003a34db:
                *piVar32 = iVar31 + 1;
              }
              else {
LAB_003a3477:
                if ('\0' < (char)bVar24) {
                  iVar31 = *(int *)((long)ref_diff_count + lVar44);
                  if ((long)iVar31 < 2) {
                    piVar32 = ref_diff_count + lVar47;
                    auVar50 = ZEXT116(cm->ref_frame_sign_bias[bVar24] ==
                                      cm->ref_frame_sign_bias[(char)*pbVar30]);
                    auVar50 = pshuflw(auVar50,auVar50,0);
                    auVar50 = psllw(auVar50,0xf);
                    auVar57 = psraw(auVar50,0xf);
                    auVar50 = ZEXT416(pMVar8->mv[lVar46].as_int) ^ auVar57;
                    *(uint *)((long)ref_diff[0] + lVar44 * 2 + (long)iVar31 * 4) =
                         CONCAT22(auVar57._2_2_ - auVar50._2_2_,auVar57._0_2_ - auVar50._0_2_);
                    goto LAB_003a34db;
                  }
                }
              }
              lVar47 = lVar47 + 1;
              lVar44 = lVar44 + 4;
              pbVar30 = pbVar30 + 1;
            } while (lVar44 == 4);
            bVar48 = lVar46 == 0;
            lVar46 = lVar46 + 1;
          } while (bVar48);
          iVar42 = iVar42 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [pMVar8->bsize];
        } while (iVar42 < (int)local_15c);
      }
      if ((local_124 != 0) && (0 < (int)local_15c)) {
        ppMVar7 = xd->mi;
        iVar19 = xd->mi_stride;
        iVar42 = 0;
        do {
          pMVar8 = ppMVar7[(long)iVar42 * (long)iVar19 + -1];
          lVar46 = 0;
          do {
            bVar24 = pMVar8->ref_frame[lVar46];
            pbVar30 = local_160;
            lVar44 = 0;
            lVar47 = 0;
            do {
              if (bVar24 == *pbVar30) {
                iVar31 = *(int *)((long)ref_id_count + lVar44);
                if (1 < (long)iVar31) goto LAB_003a35a4;
                piVar32 = (int *)((long)ref_id_count + lVar44);
                *(int_mv *)((long)tpl_sample_pos[0] + lVar44 * 2 + (long)iVar31 * 4) =
                     pMVar8->mv[lVar46];
LAB_003a3606:
                *piVar32 = iVar31 + 1;
              }
              else {
LAB_003a35a4:
                if ('\0' < (char)bVar24) {
                  iVar31 = *(int *)((long)ref_diff_count + lVar44);
                  if ((long)iVar31 < 2) {
                    piVar32 = ref_diff_count + lVar47;
                    auVar50 = ZEXT116(cm->ref_frame_sign_bias[bVar24] ==
                                      cm->ref_frame_sign_bias[(char)*pbVar30]);
                    auVar50 = pshuflw(auVar50,auVar50,0);
                    auVar50 = psllw(auVar50,0xf);
                    auVar57 = psraw(auVar50,0xf);
                    auVar50 = ZEXT416(pMVar8->mv[lVar46].as_int) ^ auVar57;
                    *(uint *)((long)ref_diff[0] + lVar44 * 2 + (long)iVar31 * 4) =
                         CONCAT22(auVar57._2_2_ - auVar50._2_2_,auVar57._0_2_ - auVar50._0_2_);
                    goto LAB_003a3606;
                  }
                }
              }
              lVar47 = lVar47 + 1;
              lVar44 = lVar44 + 4;
              pbVar30 = pbVar30 + 1;
            } while (lVar44 == 4);
            bVar48 = lVar46 == 0;
            lVar46 = lVar46 + 1;
          } while (bVar48);
          iVar42 = iVar42 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [pMVar8->bsize];
        } while (iVar42 < (int)local_15c);
      }
      paiVar22 = tpl_sample_pos;
      piVar27 = local_c8;
      paiVar20 = ref_diff;
      lVar46 = 0;
      do {
        uVar21 = 0;
        if (0 < ref_id_count[lVar46]) {
          uVar21 = (ulong)(ref_id_count[lVar46] != 1) + 1;
          uVar26 = 0;
          do {
            piVar27[uVar26 * 2] = *(int_mv *)(*paiVar22 + uVar26);
            uVar26 = uVar26 + 1;
          } while (uVar21 != uVar26);
        }
        iVar19 = ref_diff_count[lVar46];
        if ((0 < (long)iVar19) && ((uint)uVar21 < 2)) {
          uVar26 = 1;
          uVar29 = uVar21;
          do {
            piVar27[uVar29 * 2] = paiVar20[-1][uVar26 + 1];
            uVar21 = uVar29 + 1;
            if (uVar29 != 0) break;
            bVar48 = uVar26 < (ulong)(long)iVar19;
            uVar26 = uVar26 + 1;
            uVar29 = uVar21;
          } while (bVar48);
        }
        if ((uint)uVar21 < 2) {
          iVar18 = gm_mv[lVar46];
          uVar21 = uVar21 & 0xffffffff;
          do {
            piVar27[uVar21 * 2] = iVar18;
            uVar21 = uVar21 + 1;
          } while (uVar21 == 1);
        }
        paiVar22 = paiVar22 + 1;
        piVar27 = piVar27 + 1;
        paiVar20 = paiVar20 + 1;
        bVar48 = lVar46 == 0;
        lVar46 = lVar46 + 1;
      } while (bVar48);
      if (uVar23 == 0) {
        lVar46 = 0;
        do {
          local_158[*refmv_count].this_mv = local_c8[lVar46 * 2];
          local_158[*refmv_count].comp_mv = local_c8[lVar46 * 2 + 1];
          (*ref_mv_weight_00)[*refmv_count] = 2;
          *refmv_count = *refmv_count + 1;
          lVar46 = lVar46 + 1;
        } while (lVar46 == 1);
      }
      else {
        if ((local_c8[0].as_int == (local_158->this_mv).as_int) &&
           (local_c8[1].as_int == (local_158->comp_mv).as_int)) {
          local_158[uVar23].this_mv = local_c8[2];
          piVar27 = local_c8 + 3;
        }
        else {
          local_158[uVar23].this_mv.as_int = (uint32_t)local_c8[0];
          piVar27 = local_c8 + 1;
        }
        local_158[*refmv_count].comp_mv = *piVar27;
        (*ref_mv_weight_00)[*refmv_count] = 2;
        *refmv_count = *refmv_count + 1;
      }
    }
    if (*refmv_count != 0) {
      uVar6._0_1_ = xd->width;
      uVar6._1_1_ = xd->height;
      uVar6._2_2_ = *(undefined2 *)&xd->field_0x2076;
      uVar23 = (ulong)(ushort)uVar6 & 0xffffffffffff00ff;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar23;
      auVar10[0xc] = (char)((ushort)uVar6._2_2_ >> 8);
      auVar11[8] = (char)uVar6._2_2_;
      auVar11._0_8_ = uVar23;
      auVar11[9] = 0;
      auVar11._10_3_ = auVar10._10_3_;
      auVar14._5_8_ = 0;
      auVar14._0_5_ = auVar11._8_5_;
      iVar19 = (int)uVar23;
      auVar12[4] = uVar6._1_1_;
      auVar12._0_4_ = iVar19;
      auVar12[5] = 0;
      auVar12._6_7_ = SUB137(auVar14 << 0x40,6);
      iVar42 = auVar12._4_4_;
      auVar50._0_4_ = xd->mb_to_top_edge + iVar42 * -0x20 + -0x80;
      auVar50._4_4_ = xd->mb_to_left_edge + iVar19 * -0x20 + -0x80;
      auVar50._8_4_ = xd->mb_to_top_edge + iVar42 * -0x20 + -0x80;
      auVar50._12_4_ = xd->mb_to_left_edge + iVar19 * -0x20 + -0x80;
      auVar51._0_4_ = xd->mb_to_bottom_edge + iVar42 * 0x20 + 0x80;
      auVar51._4_4_ = xd->mb_to_right_edge + iVar19 * 0x20 + 0x80;
      auVar51._8_4_ = xd->mb_to_bottom_edge + iVar42 * 0x20 + 0x80;
      auVar51._12_4_ = xd->mb_to_right_edge + iVar19 * 0x20 + 0x80;
      uVar23 = 0;
      do {
        CVar52 = local_158[uVar23];
        auVar55._8_4_ = 0;
        auVar55._0_4_ = CVar52.this_mv;
        auVar55._4_4_ = CVar52.comp_mv;
        auVar55._12_2_ = CVar52.comp_mv._2_2_;
        auVar55._14_2_ = CVar52.comp_mv._2_2_;
        auVar54._12_4_ = auVar55._12_4_;
        auVar54._8_2_ = 0;
        auVar54._0_4_ = CVar52.this_mv;
        auVar54._4_4_ = CVar52.comp_mv;
        auVar54._10_2_ = CVar52.comp_mv._0_2_;
        auVar53._10_6_ = auVar54._10_6_;
        auVar53._8_2_ = CVar52.comp_mv._0_2_;
        auVar53._0_4_ = CVar52.this_mv;
        auVar53._4_4_ = CVar52.comp_mv;
        auVar15._4_8_ = auVar53._8_8_;
        auVar15._2_2_ = CVar52.this_mv._2_2_;
        auVar15._0_2_ = CVar52.this_mv._2_2_;
        auVar56._0_4_ = (int)CVar52.this_mv._0_2_;
        auVar56._4_4_ = auVar15._0_4_ >> 0x10;
        auVar56._8_4_ = auVar53._8_4_ >> 0x10;
        auVar56._12_4_ = auVar54._12_4_ >> 0x10;
        auVar58._0_4_ = -(uint)(auVar56._0_4_ < auVar50._0_4_);
        auVar58._4_4_ = -(uint)(auVar56._4_4_ < auVar50._4_4_);
        auVar58._8_4_ = -(uint)(auVar56._8_4_ < auVar50._8_4_);
        auVar58._12_4_ = -(uint)(auVar56._12_4_ < auVar50._12_4_);
        auVar59._0_4_ = -(uint)(auVar56._0_4_ < auVar51._0_4_);
        auVar59._4_4_ = -(uint)(auVar56._4_4_ < auVar51._4_4_);
        auVar59._8_4_ = -(uint)(auVar56._8_4_ < auVar51._8_4_);
        auVar59._12_4_ = -(uint)(auVar56._12_4_ < auVar51._12_4_);
        auVar57 = pshuflw(auVar50 & auVar58,
                          ~auVar58 & (~auVar59 & auVar51 | auVar56 & auVar59) | auVar50 & auVar58,
                          0xe8);
        auVar57 = pshufhw(auVar57,auVar57,0xe8);
        CVar52.this_mv.as_int = auVar57._0_4_;
        CVar52.comp_mv.as_int = auVar57._8_4_;
        local_158[uVar23] = CVar52;
        uVar23 = uVar23 + 1;
      } while (uVar23 < *refmv_count);
    }
  }
  return;
}

Assistant:

void av1_find_mv_refs(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      MB_MODE_INFO *mi, MV_REFERENCE_FRAME ref_frame,
                      uint8_t ref_mv_count[MODE_CTX_REF_FRAMES],
                      CANDIDATE_MV ref_mv_stack[][MAX_REF_MV_STACK_SIZE],
                      uint16_t ref_mv_weight[][MAX_REF_MV_STACK_SIZE],
                      int_mv mv_ref_list[][MAX_MV_REF_CANDIDATES],
                      int_mv *global_mvs, int16_t *mode_context) {
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int_mv gm_mv[2];

  if (ref_frame == INTRA_FRAME) {
    gm_mv[0].as_int = gm_mv[1].as_int = 0;
    if (global_mvs != NULL) {
      global_mvs[ref_frame].as_int = INVALID_MV;
    }
  } else {
    const BLOCK_SIZE bsize = mi->bsize;
    const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
    const int force_integer_mv = cm->features.cur_frame_force_integer_mv;
    if (ref_frame < REF_FRAMES) {
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[ref_frame],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1].as_int = 0;
      if (global_mvs != NULL) global_mvs[ref_frame] = gm_mv[0];
    } else {
      MV_REFERENCE_FRAME rf[2];
      av1_set_ref_frame(rf, ref_frame);
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[rf[0]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1] = gm_get_motion_vector(&cm->global_motion[rf[1]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
    }
  }

  setup_ref_mv_list(cm, xd, ref_frame, &ref_mv_count[ref_frame],
                    ref_mv_stack[ref_frame], ref_mv_weight[ref_frame],
                    mv_ref_list ? mv_ref_list[ref_frame] : NULL, gm_mv, mi_row,
                    mi_col, mode_context);
}